

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_permissions.cpp
# Opt level: O2

bool anon_unknown.dwarf_3c6bc92::TryParsePermissionFlags
               (string *str,NetPermissionFlags *output,
               ConnectionDirection *output_connection_direction,size_t *readen,bilingual_str *error)

{
  long lVar1;
  ulong __pos;
  string original;
  size_type sVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_type sVar4;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  NetPermissionFlags NVar6;
  long in_FS_OFFSET;
  ulong uVar7;
  undefined4 in_stack_fffffffffffffec0;
  ConnectionDirection CVar8;
  bilingual_str *in_stack_fffffffffffffec8;
  ConnectionDirection *in_stack_fffffffffffffed0;
  string local_118 [32];
  bilingual_str local_f8;
  bilingual_str local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> permission;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> permissions;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                   (str,'@',0);
  *readen = 0;
  if (args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              0xffffffffffffffff) {
    NVar6 = Implicit;
    CVar8 = In;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&permissions,str,0,(size_type)args);
    CVar8 = None;
    while (sVar2 = permissions._M_string_length, __pos = *readen,
          __pos < permissions._M_string_length) {
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&permissions,',',__pos);
      sVar5 = sVar4;
      if (sVar4 == 0xffffffffffffffff) {
        sVar5 = permissions._M_string_length;
      }
      __n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar5 - *readen);
      args = __n;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&permission,&permissions,*readen,(size_type)__n);
      *readen = (long)&(__n->_M_dataplus)._M_p + *readen + (ulong)(sVar4 != 0xffffffffffffffff);
      bVar3 = std::operator==(&permission,"bloomfilter");
      if ((bVar3) || (bVar3 = std::operator==(&permission,"bloom"), bVar3)) {
        uVar7 = (ulong)((uint)uVar7 | 2);
      }
      else {
        bVar3 = std::operator==(&permission,"noban");
        if (bVar3) {
          uVar7 = (ulong)((uint)uVar7 | 0x50);
        }
        else {
          bVar3 = std::operator==(&permission,"forcerelay");
          if (bVar3) {
            uVar7 = (ulong)((uint)uVar7 | 0xc);
          }
          else {
            bVar3 = std::operator==(&permission,"mempool");
            if (bVar3) {
              uVar7 = (ulong)((uint)uVar7 | 0x20);
            }
            else {
              bVar3 = std::operator==(&permission,"download");
              if (bVar3) {
                uVar7 = (ulong)((uint)uVar7 | 0x40);
              }
              else {
                bVar3 = std::operator==(&permission,"all");
                if (bVar3) {
                  uVar7 = (ulong)((uint)uVar7 | 0xfe);
                }
                else {
                  bVar3 = std::operator==(&permission,"relay");
                  if (bVar3) {
                    uVar7 = (ulong)((uint)uVar7 | 8);
                  }
                  else {
                    bVar3 = std::operator==(&permission,"addr");
                    if (bVar3) {
                      uVar7 = (ulong)((uint)uVar7 | 0x80);
                    }
                    else {
                      bVar3 = std::operator==(&permission,"in");
                      if (bVar3) {
                        CVar8 = CVar8 | In;
                      }
                      else {
                        bVar3 = std::operator==(&permission,"out");
                        if (bVar3) {
                          if (output_connection_direction == (ConnectionDirection *)0x0) {
                            _(&local_b8,(ConstevalStringLiteral)0xbca366);
                            bilingual_str::operator=(error,&local_b8);
                            bilingual_str::~bilingual_str(&local_b8);
                            NVar6 = (NetPermissionFlags)uVar7;
LAB_00a94212:
                            std::__cxx11::string::~string((string *)&permission);
                            goto LAB_00a940aa;
                          }
                          CVar8 = CVar8 | Out;
                        }
                        else if (permission._M_string_length != 0) {
                          _(&local_f8,(ConstevalStringLiteral)0xe4ab3c);
                          tinyformat::format<std::__cxx11::string>
                                    (&local_b8,(tinyformat *)&local_f8,(bilingual_str *)&permission,
                                     args);
                          NVar6 = (NetPermissionFlags)uVar7;
                          bilingual_str::operator=(error,&local_b8);
                          bilingual_str::~bilingual_str(&local_b8);
                          bilingual_str::~bilingual_str(&local_f8);
                          goto LAB_00a94212;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&permission);
    }
    *readen = __pos + 1;
    NVar6 = (NetPermissionFlags)uVar7;
LAB_00a940aa:
    std::__cxx11::string::~string((string *)&permissions);
    if (__pos < sVar2) {
LAB_00a940bc:
      bVar3 = false;
      goto LAB_00a941b4;
    }
    in_stack_fffffffffffffec8 = error;
    in_stack_fffffffffffffed0 = output_connection_direction;
    if (CVar8 == None) {
      CVar8 = In;
    }
    else if (NVar6 == None) {
      _(&local_f8,(ConstevalStringLiteral)0xe4ab59);
      tinyformat::format<std::__cxx11::string>
                (&local_b8,(tinyformat *)&local_f8,(bilingual_str *)str,args);
      bilingual_str::operator=(error,&local_b8);
      bilingual_str::~bilingual_str(&local_b8);
      bilingual_str::~bilingual_str(&local_f8);
      goto LAB_00a940bc;
    }
  }
  *output = NVar6;
  if (output_connection_direction != (ConnectionDirection *)0x0) {
    *output_connection_direction = CVar8;
  }
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",(allocator<char> *)&local_f8);
  original._M_string_length._0_4_ = in_stack_fffffffffffffec0;
  original._M_dataplus._M_p = (pointer)uVar7;
  original._M_string_length._4_4_ = CVar8;
  original.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffec8;
  original.field_2._8_8_ = in_stack_fffffffffffffed0;
  Untranslated(&local_b8,original);
  bilingual_str::operator=(error,&local_b8);
  bilingual_str::~bilingual_str(&local_b8);
  std::__cxx11::string::~string(local_118);
  bVar3 = true;
LAB_00a941b4:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

static bool TryParsePermissionFlags(const std::string& str, NetPermissionFlags& output, ConnectionDirection* output_connection_direction, size_t& readen, bilingual_str& error)
{
    NetPermissionFlags flags = NetPermissionFlags::None;
    ConnectionDirection connection_direction = ConnectionDirection::None;
    const auto atSeparator = str.find('@');

    // if '@' is not found (ie, "xxxxx"), the caller should apply implicit permissions
    if (atSeparator == std::string::npos) {
        NetPermissions::AddFlag(flags, NetPermissionFlags::Implicit);
        readen = 0;
    }
    // else (ie, "perm1,perm2@xxxxx"), let's enumerate the permissions by splitting by ',' and calculate the flags
    else {
        readen = 0;
        // permissions == perm1,perm2
        const auto permissions = str.substr(0, atSeparator);
        while (readen < permissions.length()) {
            const auto commaSeparator = permissions.find(',', readen);
            const auto len = commaSeparator == std::string::npos ? permissions.length() - readen : commaSeparator - readen;
            // permission == perm1
            const auto permission = permissions.substr(readen, len);
            readen += len; // We read "perm1"
            if (commaSeparator != std::string::npos) readen++; // We read ","

            if (permission == "bloomfilter" || permission == "bloom") NetPermissions::AddFlag(flags, NetPermissionFlags::BloomFilter);
            else if (permission == "noban") NetPermissions::AddFlag(flags, NetPermissionFlags::NoBan);
            else if (permission == "forcerelay") NetPermissions::AddFlag(flags, NetPermissionFlags::ForceRelay);
            else if (permission == "mempool") NetPermissions::AddFlag(flags, NetPermissionFlags::Mempool);
            else if (permission == "download") NetPermissions::AddFlag(flags, NetPermissionFlags::Download);
            else if (permission == "all") NetPermissions::AddFlag(flags, NetPermissionFlags::All);
            else if (permission == "relay") NetPermissions::AddFlag(flags, NetPermissionFlags::Relay);
            else if (permission == "addr") NetPermissions::AddFlag(flags, NetPermissionFlags::Addr);
            else if (permission == "in") connection_direction |= ConnectionDirection::In;
            else if (permission == "out") {
                if (output_connection_direction == nullptr) {
                    // Only NetWhitebindPermissions() should pass a nullptr.
                    error = _("whitebind may only be used for incoming connections (\"out\" was passed)");
                    return false;
                }
                connection_direction |= ConnectionDirection::Out;
            }
            else if (permission.length() == 0); // Allow empty entries
            else {
                error = strprintf(_("Invalid P2P permission: '%s'"), permission);
                return false;
            }
        }
        readen++;
    }

    // By default, whitelist only applies to incoming connections
    if (connection_direction == ConnectionDirection::None) {
        connection_direction = ConnectionDirection::In;
    } else if (flags == NetPermissionFlags::None) {
        error = strprintf(_("Only direction was set, no permissions: '%s'"), str);
        return false;
    }

    output = flags;
    if (output_connection_direction) *output_connection_direction = connection_direction;
    error = Untranslated("");
    return true;
}